

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::inf_or_nan_writer::operator()
          (inf_or_nan_writer *this,
          truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  inf_or_nan_writer iVar1;
  inf_or_nan_writer *piVar2;
  ulong uVar3;
  ulong uVar4;
  char *in_RCX;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> local_50;
  
  iVar1 = *this;
  if (iVar1 != (inf_or_nan_writer)0x0) {
    piVar2 = (inf_or_nan_writer *)(it->super_truncating_iterator_base<char_*>).out_;
    uVar3 = (it->super_truncating_iterator_base<char_*>).count_;
    uVar4 = (it->super_truncating_iterator_base<char_*>).limit_;
    internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator++(it);
    if (uVar3 < uVar4) {
      *piVar2 = iVar1;
    }
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char_const*,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>>
            (&local_50,*(__copy_move<false,false,std::random_access_iterator_tag> **)(this + 8),
             (char *)(*(__copy_move<false,false,std::random_access_iterator_tag> **)(this + 8) + 3),
             in_RCX,*it);
  *(ulong *)((long)&(it->super_truncating_iterator_base<char_*>).limit_ + 1) =
       CONCAT17((undefined1)local_50.super_truncating_iterator_base<char_*>.count_,
                local_50.super_truncating_iterator_base<char_*>.limit_._1_7_);
  *(undefined8 *)((long)&(it->super_truncating_iterator_base<char_*>).count_ + 1) = local_50._17_8_;
  (it->super_truncating_iterator_base<char_*>).out_ =
       local_50.super_truncating_iterator_base<char_*>.out_;
  (it->super_truncating_iterator_base<char_*>).limit_ =
       CONCAT71(local_50.super_truncating_iterator_base<char_*>.limit_._1_7_,
                (undefined1)local_50.super_truncating_iterator_base<char_*>.limit_);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (sign)
        *it++ = static_cast<char_type>(sign);
      it = internal::copy_str<char_type>(
            str, str + static_cast<std::size_t>(INF_SIZE), it);
    }